

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O1

void print<std::stack<double,std::deque<double,std::allocator<double>>>>
               (stack<double,_std::deque<double,_std::allocator<double>_>_> *t,char *s)

{
  long lVar1;
  undefined8 in_RAX;
  size_t sVar2;
  _Elt_pointer pdVar3;
  undefined8 uStack_38;
  
  lVar1 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar1 + -0x18) + 0x1100b0);
  }
  else {
    sVar2 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  if ((t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur !=
      (t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      pdVar3 = (t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pdVar3 == (t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pdVar3 = (t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      std::ostream::_M_insert<double>(pdVar3[-1]);
      std::deque<double,_std::allocator<double>_>::pop_back(&t->c);
    } while ((t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             (t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.top();
		t.pop();
	}
	std::cout << std::endl;
}